

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O2

int magic_negation(monst *mon)

{
  uint uVar1;
  xchar xVar2;
  obj *poVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  poVar3 = uarm;
  if (mon != &youmonst) {
    poVar3 = which_armor(mon,1);
  }
  uVar5 = 3;
  if (poVar3 == (obj *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    if ('\0' < objects[poVar3->otyp].oc_oc2) {
      uVar7 = (uint)(byte)objects[poVar3->otyp].oc_oc2;
    }
    uVar4 = poVar3->owt;
    if (199 < uVar4) {
      uVar1 = uVar4 / 100;
      xVar2 = mon_skill_level(0x28,mon);
      uVar6 = uVar1 - 1;
      if (xVar2 < '\x04') {
        uVar4 = (uint)(xVar2 == '\x02');
        if (xVar2 == '\x03') {
          uVar4 = 2;
        }
        if (uVar4 < uVar1) {
          uVar6 = uVar5;
        }
        if (((xVar2 < '\x04') && (uVar4 < uVar1)) && (uVar6 = 2, xVar2 != '\x03')) {
          uVar6 = (uint)(xVar2 == '\x02');
        }
      }
      else if (399 < uVar4) {
        uVar6 = uVar5;
      }
      if (uVar7 < uVar6) {
        uVar7 = uVar6;
      }
    }
  }
  poVar3 = uarmc;
  if (mon != &youmonst) {
    poVar3 = which_armor(mon,2);
  }
  if ((poVar3 != (obj *)0x0) && ((int)uVar7 <= (int)objects[poVar3->otyp].oc_oc2)) {
    uVar7 = (int)objects[poVar3->otyp].oc_oc2;
  }
  poVar3 = uarmh;
  if (mon != &youmonst) {
    poVar3 = which_armor(mon,4);
  }
  if ((poVar3 != (obj *)0x0) && ((int)uVar7 <= (int)objects[poVar3->otyp].oc_oc2)) {
    uVar7 = (int)objects[poVar3->otyp].oc_oc2;
  }
  poVar3 = uarmu;
  if (mon != &youmonst) {
    poVar3 = which_armor(mon,0x40);
  }
  if ((poVar3 != (obj *)0x0) && ((int)uVar7 <= (int)objects[poVar3->otyp].oc_oc2)) {
    uVar7 = (int)objects[poVar3->otyp].oc_oc2;
  }
  poVar3 = uarmg;
  if (mon != &youmonst) {
    poVar3 = which_armor(mon,0x10);
  }
  if ((poVar3 != (obj *)0x0) && ((int)uVar7 <= (int)objects[poVar3->otyp].oc_oc2)) {
    uVar7 = (int)objects[poVar3->otyp].oc_oc2;
  }
  poVar3 = uarmf;
  if (mon != &youmonst) {
    poVar3 = which_armor(mon,0x20);
  }
  if ((poVar3 != (obj *)0x0) && ((int)uVar7 <= (int)objects[poVar3->otyp].oc_oc2)) {
    uVar7 = (int)objects[poVar3->otyp].oc_oc2;
  }
  poVar3 = uarms;
  if (mon != &youmonst) {
    poVar3 = which_armor(mon,8);
  }
  if (poVar3 != (obj *)0x0) {
    uVar4 = (int)objects[poVar3->otyp].oc_oc2;
    if ((int)objects[poVar3->otyp].oc_oc2 < (int)uVar7) {
      uVar4 = uVar7;
    }
    uVar7 = (objects[poVar3->otyp].oc_oc1 + 1) - (uint)(poVar3->owt < 0x33);
    xVar2 = mon_skill_level(0x29,mon);
    if (xVar2 < '\x04') {
      uVar5 = 2;
      if (xVar2 != '\x03') {
        uVar5 = (uint)(xVar2 == '\x02');
      }
      if ((int)uVar7 < (int)uVar5) {
        uVar5 = uVar7;
      }
    }
    else if ((int)uVar7 < 3) {
      uVar5 = uVar7;
    }
    uVar7 = uVar5;
    if ((int)uVar5 < (int)uVar4) {
      uVar7 = uVar4;
    }
  }
  uVar5 = uVar7;
  if (((mon != &youmonst) && (poVar3 = which_armor(mon,0x100000), poVar3 != (obj *)0x0)) &&
     (uVar5 = (int)objects[poVar3->otyp].oc_oc2, (int)objects[poVar3->otyp].oc_oc2 < (int)uVar7)) {
    uVar5 = uVar7;
  }
  return uVar5;
}

Assistant:

int magic_negation(struct monst *mon)
{
	struct obj *armor;
	int armpro = 0;
	xchar sklev;
	int bonus;

	armor = (mon == &youmonst) ? uarm : which_armor(mon, W_ARM);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	/*
	 * Bonus magic cancellation for body armor skill,
	 * MC1/2/3 for basic/skilled/expert.
	 */
	if (armor && armor->owt >= 200) {
	    bonus = armor->owt / 100 - 1;
	    sklev = mon_skill_level(P_BODY_ARMOR, mon);
	    bonus = min(bonus,
			sklev >= P_EXPERT ? 3 :
			sklev == P_SKILLED ? 2 :
			sklev == P_BASIC ? 1 : 0);
	    if (armpro < bonus)
		armpro = bonus;
	}

	armor = (mon == &youmonst) ? uarmc : which_armor(mon, W_ARMC);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	armor = (mon == &youmonst) ? uarmh : which_armor(mon, W_ARMH);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;

	/* armor types for shirt, gloves, and shoes don't currently
	   provide any magic cancellation but we might as well be complete */
	armor = (mon == &youmonst) ? uarmu : which_armor(mon, W_ARMU);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	armor = (mon == &youmonst) ? uarmg : which_armor(mon, W_ARMG);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	armor = (mon == &youmonst) ? uarmf : which_armor(mon, W_ARMF);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;

	armor = (mon == &youmonst) ? uarms : which_armor(mon, W_ARMS);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;
	/*
	 * Bonus magic cancellation for shield skill,
	 * MC1/2/3 for basic/skilled/expert.
	 */
	if (armor) {
	    bonus = objects[armor->otyp].a_ac + (armor->owt > 50 ? 1 : 0);
	    sklev = mon_skill_level(P_SHIELD, mon);
	    bonus = min(bonus,
			sklev >= P_EXPERT ? 3 :
			sklev == P_SKILLED ? 2 :
			sklev == P_BASIC ? 1 : 0);
	    if (armpro < bonus)
		armpro = bonus;
	}

	/* this one is really a stretch... */
	armor = (mon == &youmonst) ? 0 : which_armor(mon, W_SADDLE);
	if (armor && armpro < objects[armor->otyp].a_can)
	    armpro = objects[armor->otyp].a_can;

	return armpro;
}